

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QObject_*(*)()>::reallocate
          (QPodArrayOps<QObject_*(*)()> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QObject_*(*)()>_*,_QObject_*(**)()> pVar1;
  
  pVar1 = QTypedArrayData<QObject_*(*)()>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<QObject_*(*)()>).d,
                     (this->super_QArrayDataPointer<QObject_*(*)()>).ptr,alloc,option);
  if (pVar1.second != (_func_QObject_ptr **)0x0) {
    (this->super_QArrayDataPointer<QObject_*(*)()>).d = pVar1.first;
    (this->super_QArrayDataPointer<QObject_*(*)()>).ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }